

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void anon_unknown.dwarf_113fb::_process_pixels
               (uint8_t *dst,uint8_t *src,int width,int height,int stride,int channels,
               bool bFlipColors,bool bFlip)

{
  int iVar1;
  int local_70;
  int local_6c;
  int j_1;
  int x_1;
  uint8_t *p_src;
  uint8_t *p_dst;
  int local_50;
  int y_3;
  int j;
  int i;
  int y_2;
  int x;
  int y_1;
  int y;
  int SrcnumBytes;
  int DstWidthInBytes;
  int SrcWidthInbytes;
  bool bFlip_local;
  bool bFlipColors_local;
  int channels_local;
  int stride_local;
  int height_local;
  int width_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  iVar1 = width * channels;
  if (bFlipColors) {
    if (bFlip) {
      i = 0;
      _height_local = src + (height + -1) * iVar1;
      src_local = dst;
      for (y_3 = 0; y_3 < iVar1 * height; y_3 = channels + y_3) {
        if (width <= i) {
          i = 0;
          _height_local = _height_local + -(long)(iVar1 * 2);
          src_local = src_local + (stride - width);
        }
        for (local_50 = channels + -1; -1 < local_50; local_50 = local_50 + -1) {
          *src_local = _height_local[local_50];
          src_local = src_local + 1;
        }
        _height_local = _height_local + channels;
        i = i + 1;
      }
    }
    else {
      for (p_dst._4_4_ = 0; p_dst._4_4_ < height; p_dst._4_4_ = p_dst._4_4_ + 1) {
        p_src = dst + p_dst._4_4_ * stride;
        _j_1 = src + p_dst._4_4_ * width;
        for (local_6c = 0; local_6c < width; local_6c = local_6c + 1) {
          for (local_70 = channels + -1; -1 < local_70; local_70 = local_70 + -1) {
            *p_src = _j_1[local_70];
            p_src = p_src + 1;
          }
          _j_1 = _j_1 + channels;
        }
      }
    }
  }
  else if (bFlip) {
    for (x = 0; x < height; x = x + 1) {
      memcpy(dst + x * stride * channels,src + ((height - x) + -1) * iVar1,(long)iVar1);
    }
  }
  else {
    for (y_2 = 0; y_2 < height; y_2 = y_2 + 1) {
      memcpy(dst + y_2 * stride * channels,src + y_2 * iVar1,(long)iVar1);
    }
  }
  return;
}

Assistant:

void _process_pixels(uint8_t* dst, const uint8_t* src, int width, int height, int stride, int channels, bool bFlipColors, bool bFlip)
    {
    int SrcWidthInbytes = width * channels;
    int DstWidthInBytes = stride * channels;
    int SrcnumBytes = SrcWidthInbytes * height;

    if (!bFlipColors)
      {
      if (bFlip)
        {
        for (int y = 0; y < height; ++y)
          {
          memcpy(dst + (y * DstWidthInBytes), src + ((height - y - 1) * SrcWidthInbytes), SrcWidthInbytes);
          }
        }
      else {
        for (int y = 0; y < height; ++y)
          {
          memcpy(dst + (y * DstWidthInBytes), src + (y * SrcWidthInbytes), SrcWidthInbytes);
          }
        }
      }
    else {
      if (bFlip)
        {
        int x = 0;
        int y = (height - 1) * SrcWidthInbytes;
        src += y;

        for (int i = 0; i < SrcnumBytes; i += channels)
          {
          if (x >= width)
            {
            x = 0;
            src -= SrcWidthInbytes * 2;
            dst += (stride - width);
            }

          for (int j = channels - 1; j >= 0; --j)
            {
            *dst = *(src + j);
            ++dst;
            }

          src += channels;
          ++x;
          }
        }
      else 
        {
        for (int y = 0; y < height; ++y)
          {
          uint8_t* p_dst = dst + y * stride;
          const uint8_t* p_src = src + y * width;
          for (int x = 0; x < width; ++x)
            {
            for (int j = channels - 1; j >= 0; --j)
              {
              *p_dst = *(p_src + j);
              ++p_dst;
              }
            p_src += channels;
            }
          }
        }
      }
    }